

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Lit LVar4;
  char *pcVar5;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *this_00;
  vec<Minisat::Watcher> *this_01;
  Var in_ESI;
  long in_RDI;
  int i_5;
  int j_1;
  int i_4;
  vec<Minisat::Lit> *resolvent;
  int i_3;
  int i_2;
  int j;
  int i_1;
  int clause_size;
  int cnt;
  int i;
  vec<unsigned_int> neg;
  vec<unsigned_int> pos;
  vec<unsigned_int> *cls;
  undefined4 in_stack_fffffffffffffd28;
  Ref in_stack_fffffffffffffd2c;
  undefined1 dealloc;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>
  *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  Var in_stack_fffffffffffffd3c;
  Solver *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  SimpSolver *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined8 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  vec<Minisat::Lit> *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined8 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  Clause *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined1 in_stack_fffffffffffffdc7;
  SimpSolver *in_stack_fffffffffffffdc8;
  int local_94;
  int local_90;
  int local_8c;
  int local_74;
  int local_6c;
  int local_64;
  int local_60;
  int local_58;
  int local_50;
  vec<unsigned_int> local_40;
  vec<unsigned_int> local_30;
  vec<unsigned_int> *local_20;
  Var local_14;
  bool local_1;
  
  local_14 = in_ESI;
  local_20 = OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::lookup
                       ((OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>
                         *)in_stack_fffffffffffffd40,
                        (int *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  vec<unsigned_int>::vec(&local_30);
  vec<unsigned_int>::vec(&local_40);
  for (local_50 = 0; iVar2 = vec<unsigned_int>::size(local_20), local_50 < iVar2;
      local_50 = local_50 + 1) {
    vec<unsigned_int>::operator[](local_20,local_50);
    ClauseAllocator::operator[]
              ((ClauseAllocator *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
    mkLit(local_14,false);
    find<Minisat::Clause,Minisat::Lit>
              ((Clause *)in_stack_fffffffffffffd40,
               (Lit *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    vec<unsigned_int>::operator[](local_20,local_50);
    vec<unsigned_int>::push
              ((vec<unsigned_int> *)in_stack_fffffffffffffd30,
               (uint *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  }
  iVar2 = vec<unsigned_int>::size(local_20);
  *(long *)(in_RDI + 0x200) = (long)iVar2 + *(long *)(in_RDI + 0x200);
  local_58 = 0;
  local_60 = 0;
  do {
    iVar2 = vec<unsigned_int>::size(&local_30);
    if (iVar2 <= local_60) {
      pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x14f0),local_14);
      *pcVar5 = '\x01';
      Solver::setDecisionVar
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                 SUB41((uint)in_stack_fffffffffffffd38 >> 0x18,0));
      *(int *)(in_RDI + 0x1428) = *(int *)(in_RDI + 0x1428) + 1;
      iVar2 = vec<unsigned_int>::size(&local_30);
      iVar3 = vec<unsigned_int>::size(&local_40);
      if (iVar3 < iVar2) {
        for (local_6c = 0; iVar2 = vec<unsigned_int>::size(&local_40), local_6c < iVar2;
            local_6c = local_6c + 1) {
          vec<unsigned_int>::operator[](&local_40,local_6c);
          ClauseAllocator::operator[]
                    ((ClauseAllocator *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
          mkElimClause((vec<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       (Var)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                       (Clause *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        }
        mkLit(local_14,false);
        mkElimClause((vec<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                     (Lit)(int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
        iVar2 = vec<unsigned_int>::size(&local_40);
        *(long *)(in_RDI + 0x200) = (long)iVar2 + *(long *)(in_RDI + 0x200);
      }
      else {
        for (local_74 = 0; iVar2 = vec<unsigned_int>::size(&local_30), local_74 < iVar2;
            local_74 = local_74 + 1) {
          vec<unsigned_int>::operator[](&local_30,local_74);
          ClauseAllocator::operator[]
                    ((ClauseAllocator *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
          mkElimClause((vec<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       (Var)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                       (Clause *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        }
        LVar4 = mkLit(local_14,false);
        operator~(LVar4);
        mkElimClause((vec<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                     (Lit)(int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
        iVar2 = vec<unsigned_int>::size(&local_30);
        *(long *)(in_RDI + 0x200) = (long)iVar2 + *(long *)(in_RDI + 0x200);
      }
      for (local_8c = 0; iVar2 = vec<unsigned_int>::size(&local_30), local_8c < iVar2;
          local_8c = local_8c + 1) {
        iVar2 = vec<unsigned_int>::size(&local_40);
        *(long *)(in_RDI + 0x200) = (long)iVar2 + *(long *)(in_RDI + 0x200);
        for (local_90 = 0; iVar2 = vec<unsigned_int>::size(&local_40), local_90 < iVar2;
            local_90 = local_90 + 1) {
          vec<unsigned_int>::operator[](&local_30,local_8c);
          ClauseAllocator::operator[]
                    ((ClauseAllocator *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
          vec<unsigned_int>::operator[](&local_40,local_90);
          in_stack_fffffffffffffdc8 =
               (SimpSolver *)
               ClauseAllocator::operator[]
                         ((ClauseAllocator *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
          in_stack_fffffffffffffdc7 =
               merge((SimpSolver *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     in_stack_fffffffffffffdb0,
                     (Clause *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     (Var)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                     (vec<Minisat::Lit> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          if (((bool)in_stack_fffffffffffffdc7) &&
             (bVar1 = addClause_((SimpSolver *)
                                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                                 in_stack_fffffffffffffd90), !bVar1)) {
            local_1 = false;
            goto LAB_0015db87;
          }
        }
      }
      local_94 = 0;
      while (iVar2 = local_94, iVar3 = vec<unsigned_int>::size(local_20), iVar2 < iVar3) {
        vec<unsigned_int>::operator[](local_20,local_94);
        removeClause((SimpSolver *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     (CRef)((ulong)in_stack_fffffffffffffd68 >> 0x20));
        local_94 = local_94 + 1;
      }
      iVar2 = vec<unsigned_int>::size(local_20);
      *(long *)(in_RDI + 0x200) = *(long *)(in_RDI + 0x200) + (long)iVar2;
      OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::operator[]
                (in_stack_fffffffffffffd30,
                 (int *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      dealloc = (undefined1)(in_stack_fffffffffffffd2c >> 0x18);
      vec<unsigned_int>::clear((vec<unsigned_int> *)in_stack_fffffffffffffd30,(bool)dealloc);
      mkLit(local_14,false);
      OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::operator[]
                ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
                 in_stack_fffffffffffffd40,
                 (Lit *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      vec<Minisat::Watcher>::clear((vec<Minisat::Watcher> *)in_stack_fffffffffffffd30,(bool)dealloc)
      ;
      LVar4 = mkLit(local_14,false);
      operator~(LVar4);
      OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::operator[]
                ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
                 in_stack_fffffffffffffd40,
                 (Lit *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      vec<Minisat::Watcher>::clear((vec<Minisat::Watcher> *)in_stack_fffffffffffffd30,(bool)dealloc)
      ;
      mkLit(local_14,false);
      OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::operator[]
                ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
                 in_stack_fffffffffffffd40,
                 (Lit *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      vec<Minisat::Watcher>::clear((vec<Minisat::Watcher> *)in_stack_fffffffffffffd30,(bool)dealloc)
      ;
      this_00 = (OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
                (in_RDI + 0x2e8);
      LVar4 = mkLit(local_14,false);
      LVar4 = operator~(LVar4);
      this_01 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::
                operator[](this_00,(Lit *)CONCAT44(LVar4.x,in_stack_fffffffffffffd38));
      vec<Minisat::Watcher>::clear(this_01,(bool)dealloc);
      local_1 = backwardSubsumptionCheck(in_stack_fffffffffffffdc8,(bool)in_stack_fffffffffffffdc7);
LAB_0015db87:
      vec<unsigned_int>::~vec((vec<unsigned_int> *)0x15db94);
      vec<unsigned_int>::~vec((vec<unsigned_int> *)0x15dba1);
      return (bool)(local_1 & 1);
    }
    iVar2 = vec<unsigned_int>::size(&local_40);
    *(long *)(in_RDI + 0x200) = (long)iVar2 + *(long *)(in_RDI + 0x200);
    for (local_64 = 0; iVar2 = vec<unsigned_int>::size(&local_40), local_64 < iVar2;
        local_64 = local_64 + 1) {
      vec<unsigned_int>::operator[](&local_30,local_60);
      ClauseAllocator::operator[]
                ((ClauseAllocator *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
      vec<unsigned_int>::operator[](&local_40,local_64);
      ClauseAllocator::operator[]
                ((ClauseAllocator *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
      bVar1 = merge(in_stack_fffffffffffffd50,
                    (Clause *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                    (Clause *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                    (int *)in_stack_fffffffffffffd30);
      if (bVar1) {
        local_58 = local_58 + 1;
        iVar2 = vec<unsigned_int>::size(local_20);
        if ((iVar2 + *(int *)(in_RDI + 0x13fc) < local_58) ||
           ((*(int *)(in_RDI + 0x1400) != -1 && (*(int *)(in_RDI + 0x1400) < 0)))) {
          local_1 = true;
          goto LAB_0015db87;
        }
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef> &cls = occurs.lookup(v);
    vec<CRef> pos, neg;
    for (int i = 0; i < cls.size(); i++) (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);
    statistics.simpSteps += cls.size();

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt = 0;
    int clause_size = 0;

    for (int i = 0; i < pos.size(); i++) {
        statistics.simpSteps += neg.size();
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) &&
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;
    }

    // Delete and store old clauses:
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()) {
        for (int i = 0; i < neg.size(); i++) mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
        statistics.simpSteps += neg.size();
    } else {
        for (int i = 0; i < pos.size(); i++) mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
        statistics.simpSteps += pos.size();
    }

    // Produce clauses in cross product:
    vec<Lit> &resolvent = add_tmp;
    for (int i = 0; i < pos.size(); i++) {
        statistics.simpSteps += neg.size();
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent)) return false;
    }

    for (int i = 0; i < cls.size(); i++) removeClause(cls[i]);
    statistics.simpSteps += cls.size();

    // Free occurs list for this variable:
    occurs[v].clear(true);

    // Free watchers lists for this variable, if possible:
    watches_bin[mkLit(v)].clear(true);
    watches_bin[~mkLit(v)].clear(true);
    watches[mkLit(v)].clear(true);
    watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}